

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.hpp
# Opt level: O0

signature_element *
boost::python::detail::signature_arity<1U>::impl<boost::mpl::vector2<long_&,_timestamp_t_&>_>::
elements(void)

{
  int iVar1;
  type_info *in_stack_ffffffffffffffc0;
  
  if (signature_arity<1u>::impl<boost::mpl::vector2<long&,timestamp_t&>>::elements()::result == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&signature_arity<1u>::impl<boost::mpl::vector2<long&,timestamp_t&>>
                                 ::elements()::result);
    if (iVar1 != 0) {
      type_id<long&>();
      elements::result[0].basename = type_info::name(in_stack_ffffffffffffffc0);
      elements::result[0].pytype_f = converter::expected_pytype_for_arg<long_&>::get_pytype;
      elements::result[0].lvalue = true;
      type_id<timestamp_t&>();
      elements::result[1].basename = type_info::name(in_stack_ffffffffffffffc0);
      elements::result[1].pytype_f = converter::expected_pytype_for_arg<timestamp_t_&>::get_pytype;
      elements::result[1].lvalue = true;
      memset(elements::result + 2,0,0x18);
      __cxa_guard_release(&signature_arity<1u>::impl<boost::mpl::vector2<long&,timestamp_t&>>::
                           elements()::result);
    }
  }
  return elements::result;
}

Assistant:

static signature_element const* elements()
        {
            static signature_element const result[N+2] = {
                
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , &converter::expected_pytype_for_arg<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::get_pytype   \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#else
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , 0 \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#endif
                
# define BOOST_PP_LOCAL_LIMITS (0, N)
# include BOOST_PP_LOCAL_ITERATE()
                {0,0,0}
            };
            return result;
        }